

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

uint32_t __thiscall rgbcx::hist4::lookup_total_ordering_index(hist4 *this)

{
  uint uVar1;
  
  if (this->m_hist[0] == 0x10) {
    return 0xf;
  }
  uVar1 = 700;
  if (this->m_hist[1] != 0x10) {
    uVar1 = 0x2f1;
    if ((this->m_hist[2] != 0x10) && (uVar1 = 0x203, this->m_hist[3] != '\x10')) {
      uVar1 = (uint)*(ushort *)
                     (g_total_ordering4_hash +
                     ((uint)this->m_hist[2] << 9 |
                     (uint)this->m_hist[1] << 5 | (uint)this->m_hist[0] * 2));
    }
  }
  return uVar1;
}

Assistant:

inline uint32_t lookup_total_ordering_index() const
		{
			if (m_hist[0] == 16)
				return TOTAL_ORDER_4_0_16;
			else if (m_hist[1] == 16)
				return TOTAL_ORDER_4_1_16;
			else if (m_hist[2] == 16)
				return TOTAL_ORDER_4_2_16;
			else if (m_hist[3] == 16)
				return TOTAL_ORDER_4_3_16;

			// Must sum to 16, so m_hist[3] isn't needed.
			return g_total_ordering4_hash[m_hist[0] | (m_hist[1] << 4) | (m_hist[2] << 8)];
		}